

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>::add_layer
          (add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void> *this)

{
  input_rgb_image *in_RDI;
  con_<64L,_7L,_7L,_2,_2,_0,_0> *in_stack_ffffffffffffffc0;
  resizable_tensor *this_00;
  
  input_rgb_image::input_rgb_image(in_RDI);
  this_00 = (resizable_tensor *)&in_RDI[1].avg_green;
  con_<64L,_7L,_7L,_2,_2,_0,_0>::con_(in_stack_ffffffffffffffc0);
  *(undefined1 *)&in_RDI[0x21].avg_green = 0;
  *(undefined1 *)((long)&in_RDI[0x21].avg_green + 1) = 1;
  *(undefined1 *)((long)&in_RDI[0x21].avg_green + 2) = 0;
  in_RDI[0x21].avg_blue = 0.0;
  resizable_tensor::resizable_tensor(this_00);
  resizable_tensor::resizable_tensor(this_00);
  resizable_tensor::resizable_tensor(this_00);
  resizable_tensor::resizable_tensor(this_00);
  resizable_tensor::resizable_tensor(this_00);
  return;
}

Assistant:

add_layer(
        ): 
            this_layer_setup_called(false),
            gradient_input_is_stale(true),
            get_output_and_gradient_input_disabled(false),
            _sample_expansion_factor(0)
        {}